

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  unsigned_long uVar5;
  char *pcVar6;
  uint uVar7;
  ulong dindex;
  Directory d;
  string fname;
  string startPath;
  string finishPath;
  allocator local_ba;
  allocator local_b9;
  Directory local_b8;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  lVar4 = std::__cxx11::string::find((char *)path,0x5b1575,0);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)path);
    std::__cxx11::string::substr((ulong)local_70,(ulong)path);
    cmsys::Directory::Directory(&local_b8);
    bVar2 = cmsys::Directory::Load(&local_b8,&local_90);
    if (bVar2) {
      paVar1 = &local_b0.field_2;
      uVar7 = 0;
      while( true ) {
        uVar5 = cmsys::Directory::GetNumberOfFiles(&local_b8);
        dindex = (ulong)uVar7;
        if (uVar5 <= dindex) break;
        pcVar6 = cmsys::Directory::GetFile(&local_b8,dindex);
        std::__cxx11::string::string((string *)&local_b0,pcVar6,&local_b9);
        iVar3 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar3 == 0) {
          bVar2 = false;
        }
        else {
          pcVar6 = cmsys::Directory::GetFile(&local_b8,dindex);
          std::__cxx11::string::string((string *)local_50,pcVar6,&local_ba);
          iVar3 = std::__cxx11::string::compare((char *)local_50);
          bVar2 = iVar3 != 0;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_b0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_90._M_dataplus._M_p,
                     local_90._M_dataplus._M_p + local_90._M_string_length);
          std::__cxx11::string::append((char *)&local_b0);
          cmsys::Directory::GetFile(&local_b8,dindex);
          std::__cxx11::string::append((char *)&local_b0);
          bVar2 = cmsys::SystemTools::FileIsDirectory(&local_b0);
          if (bVar2) {
            std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70[0]);
            GlobDirs(&local_b0,files);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        uVar7 = uVar7 + 1;
      }
    }
    cmsys::Directory::~Directory(&local_b8);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(files,path);
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = startPath;
        fname += "/";
        fname += d.GetFile(i);
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}